

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Module.cpp
# Opt level: O0

void __thiscall soul::Module::Module(Module *this,Program *p,ModuleType type)

{
  Allocator *pAVar1;
  ModuleType type_local;
  Program *p_local;
  Module *this_local;
  
  Program::Program(&this->program,p->pimpl,false);
  std::__cxx11::string::string((string *)&this->shortName);
  std::__cxx11::string::string((string *)&this->fullName);
  std::__cxx11::string::string((string *)&this->originalFullName);
  std::
  vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
  ::vector(&this->inputs);
  std::
  vector<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
  ::vector(&this->outputs);
  std::
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ::vector(&this->connections);
  std::
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ::vector(&this->processorInstances);
  Annotation::Annotation(&this->annotation);
  this->sampleRate = 0.0;
  this->latency = 0;
  CodeLocation::CodeLocation(&this->location);
  this->moduleUseTestFlag = false;
  pAVar1 = Program::getAllocator(p);
  this->allocator = pAVar1;
  Functions::Functions(&this->functions,this);
  StateVariables::StateVariables(&this->stateVariables);
  Structs::Structs(&this->structs);
  this->moduleID = 0;
  this->moduleType = type;
  return;
}

Assistant:

Module::Module (Program& p, ModuleType type)
   : program (*p.pimpl, false), allocator (p.getAllocator()), functions (*this), moduleType (type)
{
}